

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O0

int bip38_from_private_key
              (uchar *bytes,size_t bytes_len,uchar *pass,size_t pass_len,uint32_t flags,
              char **output)

{
  int local_70;
  undefined1 local_6c;
  uchar auStack_6b [3];
  int ret;
  bip38_layout_t buf;
  char **output_local;
  uint32_t flags_local;
  size_t pass_len_local;
  uchar *pass_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (output == (char **)0x0) {
    bytes_local._4_4_ = -2;
  }
  else {
    *output = (char *)0x0;
    buf._36_8_ = output;
    local_70 = bip38_raw_from_private_key(bytes,bytes_len,pass,pass_len,flags,auStack_6b,0x27);
    if (local_70 == 0) {
      local_70 = wally_base58_from_bytes(auStack_6b,0x27,1,(char **)buf._36_8_);
    }
    wally_clear(&local_6c,0x2c);
    bytes_local._4_4_ = local_70;
  }
  return bytes_local._4_4_;
}

Assistant:

int bip38_from_private_key(const unsigned char *bytes, size_t bytes_len,
                           const unsigned char *pass, size_t pass_len,
                           uint32_t flags, char **output)
{
    struct bip38_layout_t buf;
    int ret;

    if (!output)
        return WALLY_EINVAL;

    *output = NULL;

    ret = bip38_raw_from_private_key(bytes, bytes_len, pass, pass_len,
                                     flags, &buf.prefix, BIP38_SERIALIZED_LEN);
    if (!ret)
        ret = wally_base58_from_bytes(&buf.prefix, BIP38_SERIALIZED_LEN,
                                      BASE58_FLAG_CHECKSUM, output);

    wally_clear(&buf, sizeof(buf));
    return ret;
}